

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::VertexShaderTestInstance::draw
          (VertexShaderTestInstance *this,VkCommandBuffer cmdBuffer)

{
  VkPrimitiveTopology VVar1;
  DeviceInterface *pDVar2;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  VertexShaderTestInstance *this_local;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->primitiveTopology;
  if (VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST < VVar1) {
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,0);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,8,2);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,4,1,0xc,3);
      return;
    }
    if (4 < VVar1 - VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) {
      return;
    }
  }
  (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,cmdBuffer,0x10,1,0);
  return;
}

Assistant:

void VertexShaderTestInstance::draw (VkCommandBuffer cmdBuffer)
{
	const DeviceInterface& vk = m_context.getDeviceInterface();
	switch(m_parametersGraphic.primitiveTopology)
	{
		case VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
			vk.cmdDraw(cmdBuffer, 16u, 1u, 0u, 0u);
			break;
		case VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			vk.cmdDraw(cmdBuffer, 4u, 1u, 0u,  0u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 4u,  1u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 8u,  2u);
			vk.cmdDraw(cmdBuffer, 4u, 1u, 12u, 3u);
			break;
		default:
			DE_ASSERT(0);
			break;
	}
}